

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

int xmlXPathCompOpEvalFilterFirst
              (xmlXPathParserContextPtr ctxt,xmlXPathStepOpPtr op,xmlNodePtr *first)

{
  int iVar1;
  xmlXPathCompExprPtr pxVar2;
  xmlXPathStepOp *pxVar3;
  xmlXPathObjectPtr *ppxVar4;
  xmlNodeSetPtr pxVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  long lVar9;
  xmlXPathObjectPtr pxVar10;
  xmlNodePtr last;
  xmlNodePtr local_30;
  
  if (ctxt->error != 0) {
    return 0;
  }
  iVar8 = op->ch1;
  iVar6 = 0;
  if ((long)iVar8 != -1) {
    pxVar2 = ctxt->comp;
    lVar9 = (long)op->ch2;
    if (((((lVar9 != -1) && (pxVar3 = pxVar2->steps, pxVar3[iVar8].op == XPATH_OP_SORT)) &&
         (pxVar3[lVar9].op == XPATH_OP_SORT)) &&
        ((lVar9 = (long)pxVar3[lVar9].ch1, lVar9 != -1 && (pxVar3[lVar9].op == XPATH_OP_FUNCTION))))
       && ((pxVar3[lVar9].value5 == (void *)0x0 &&
           ((pxVar3[lVar9].value == 0 && ((xmlChar *)pxVar3[lVar9].value4 != (xmlChar *)0x0)))))) {
      iVar6 = xmlStrEqual((xmlChar *)pxVar3[lVar9].value4,(xmlChar *)"last");
      iVar8 = op->ch1;
      if (iVar6 != 0) {
        local_30 = (xmlNodePtr)0x0;
        iVar8 = xmlXPathCompOpEvalLast(ctxt,pxVar2->steps + iVar8,&local_30);
        if (ctxt->error != 0) {
          return 0;
        }
        pxVar10 = ctxt->value;
        if (pxVar10 == (xmlXPathObjectPtr)0x0) {
          return iVar8;
        }
        if (pxVar10->type != XPATH_NODESET) {
          return iVar8;
        }
        pxVar5 = pxVar10->nodesetval;
        if (pxVar5 == (xmlNodeSetPtr)0x0) {
          return iVar8;
        }
        if (pxVar5->nodeTab == (xmlNodePtr *)0x0) {
          return iVar8;
        }
        if (pxVar5->nodeNr < 2) {
          return iVar8;
        }
        xmlXPathNodeSetKeepLast(pxVar5);
        *first = *ctxt->value->nodesetval->nodeTab;
        return iVar8;
      }
      iVar6 = 0;
      if (iVar8 == -1) goto LAB_001c6775;
    }
    iVar6 = xmlXPathCompOpEval(ctxt,pxVar2->steps + iVar8);
  }
LAB_001c6775:
  if (ctxt->error == 0) {
    iVar8 = op->ch2;
    if (iVar8 == -1) {
      return iVar6;
    }
    if (ctxt->value == (xmlXPathObjectPtr)0x0) {
      return iVar6;
    }
    if (ctxt->value->type == XPATH_NODESET) {
      iVar1 = ctxt->valueNr;
      if ((long)iVar1 < 1) {
        pxVar10 = (xmlXPathObjectPtr)0x0;
      }
      else {
        uVar7 = iVar1 - 1;
        ctxt->valueNr = uVar7;
        ppxVar4 = ctxt->valueTab;
        if (iVar1 == 1) {
          pxVar10 = (xmlXPathObjectPtr)0x0;
        }
        else {
          pxVar10 = ppxVar4[(long)iVar1 + -2];
        }
        ctxt->value = pxVar10;
        pxVar10 = ppxVar4[uVar7];
        ppxVar4[uVar7] = (xmlXPathObjectPtr)0x0;
      }
      pxVar5 = pxVar10->nodesetval;
      if ((pxVar5 != (xmlNodeSetPtr)0x0) &&
         (xmlXPathNodeSetFilter(ctxt,pxVar5,iVar8,1,1,1), 0 < pxVar5->nodeNr)) {
        *first = *pxVar5->nodeTab;
      }
      xmlXPathValuePush(ctxt,pxVar10);
      return iVar6;
    }
    xmlXPathErr(ctxt,0xb);
  }
  return 0;
}

Assistant:

static int
xmlXPathCompOpEvalFilterFirst(xmlXPathParserContextPtr ctxt,
			      xmlXPathStepOpPtr op, xmlNodePtr * first)
{
    int total = 0;
    xmlXPathCompExprPtr comp;
    xmlXPathObjectPtr obj;
    xmlNodeSetPtr set;

    CHECK_ERROR0;
    comp = ctxt->comp;
    /*
    * Optimization for ()[last()] selection i.e. the last elem
    */
    if ((op->ch1 != -1) && (op->ch2 != -1) &&
	(comp->steps[op->ch1].op == XPATH_OP_SORT) &&
	(comp->steps[op->ch2].op == XPATH_OP_SORT)) {
	int f = comp->steps[op->ch2].ch1;

	if ((f != -1) &&
	    (comp->steps[f].op == XPATH_OP_FUNCTION) &&
	    (comp->steps[f].value5 == NULL) &&
	    (comp->steps[f].value == 0) &&
	    (comp->steps[f].value4 != NULL) &&
	    (xmlStrEqual
	    (comp->steps[f].value4, BAD_CAST "last"))) {
	    xmlNodePtr last = NULL;

	    total +=
		xmlXPathCompOpEvalLast(ctxt,
		    &comp->steps[op->ch1],
		    &last);
	    CHECK_ERROR0;
	    /*
	    * The nodeset should be in document order,
	    * Keep only the last value
	    */
	    if ((ctxt->value != NULL) &&
		(ctxt->value->type == XPATH_NODESET) &&
		(ctxt->value->nodesetval != NULL) &&
		(ctxt->value->nodesetval->nodeTab != NULL) &&
		(ctxt->value->nodesetval->nodeNr > 1)) {
                xmlXPathNodeSetKeepLast(ctxt->value->nodesetval);
		*first = *(ctxt->value->nodesetval->nodeTab);
	    }
	    return (total);
	}
    }

    if (op->ch1 != -1)
	total += xmlXPathCompOpEval(ctxt, &comp->steps[op->ch1]);
    CHECK_ERROR0;
    if (op->ch2 == -1)
	return (total);
    if (ctxt->value == NULL)
	return (total);

    /*
     * In case of errors, xmlXPathNodeSetFilter can pop additional nodes from
     * the stack. We have to temporarily remove the nodeset object from the
     * stack to avoid freeing it prematurely.
     */
    CHECK_TYPE0(XPATH_NODESET);
    obj = xmlXPathValuePop(ctxt);
    set = obj->nodesetval;
    if (set != NULL) {
        xmlXPathNodeSetFilter(ctxt, set, op->ch2, 1, 1, 1);
        if (set->nodeNr > 0)
            *first = set->nodeTab[0];
    }
    xmlXPathValuePush(ctxt, obj);

    return (total);
}